

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::GrowCapacity
          (ExtensionSet *this,size_t minimum_new_capacity)

{
  bool bVar1;
  KeyValue *__first;
  KeyValue *__last;
  LogMessage *pLVar2;
  iterator iVar3;
  iterator iVar4;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  other;
  const_iterator hint_00;
  ushort local_104;
  LogMessage local_e0;
  Voidify local_c9;
  KeyValue *local_c8;
  int local_c0;
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> local_b8;
  KeyValue *local_98;
  int iStack_90;
  undefined1 local_88 [12];
  KeyValue *local_78;
  int local_70;
  KeyValue *local_68;
  KeyValue *it;
  int local_58;
  KeyValue *pKStack_50;
  iterator hint;
  Arena *arena;
  AllocatedData new_map;
  KeyValue *end;
  KeyValue *begin;
  uint16_t new_flat_capacity;
  size_t minimum_new_capacity_local;
  ExtensionSet *this_local;
  
  bVar1 = is_large(this);
  if ((!bVar1) && (this->flat_capacity_ < minimum_new_capacity)) {
    begin._6_2_ = this->flat_capacity_;
    do {
      if (begin._6_2_ == 0) {
        local_104 = 1;
      }
      else {
        local_104 = begin._6_2_ << 2;
      }
      begin._6_2_ = local_104;
    } while (local_104 < minimum_new_capacity);
    __first = flat_begin(this);
    __last = flat_end(this);
    hint._8_8_ = this->arena_;
    if (local_104 < 0x101) {
      arena = (Arena *)AllocateFlatMap((Arena *)hint._8_8_,local_104);
      std::
      copy<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue*>
                (__first,__last,(KeyValue *)arena);
    }
    else {
      arena = (Arena *)Arena::
                       Create<absl::lts_20250127::btree_map<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>>
                                 ((Arena *)hint._8_8_);
      iVar3 = absl::lts_20250127::container_internal::
              btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
              ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                       *)arena);
      it = (KeyValue *)iVar3.node_;
      local_58 = iVar3.position_;
      pKStack_50 = it;
      hint.node_._0_4_ = local_58;
      for (local_68 = __first; local_68 != __last; local_68 = local_68 + 1) {
        local_98 = pKStack_50;
        iStack_90 = (int)hint.node_;
        other.position_ = (int)hint.node_;
        other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                       *)pKStack_50;
        other._12_4_ = 0;
        absl::lts_20250127::container_internal::
        btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
        ::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*,_0>
                  ((btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    *)local_88,other);
        std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>::
        pair<const_int,_google::protobuf::internal::ExtensionSet::Extension,_true>
                  (&local_b8,&local_68->first,&local_68->second);
        hint_00._12_4_ = 0;
        hint_00.node_ =
             (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              *)local_88._0_8_;
        hint_00.position_ = local_88._8_4_;
        iVar4 = absl::lts_20250127::container_internal::
                btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                ::insert((btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                          *)arena,hint_00,&local_b8);
        local_c8 = (KeyValue *)iVar4.node_;
        local_c0 = iVar4.position_;
        local_78 = local_c8;
        local_70 = local_c0;
        pKStack_50 = local_c8;
        hint.node_._0_4_ = local_c0;
      }
      this->flat_size_ = 0xffff;
      bVar1 = is_large(this);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x708,"is_large()");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
    }
    if (this->flat_capacity_ != 0) {
      if (hint._8_8_ == 0) {
        DeleteFlatMap(__first,this->flat_capacity_);
      }
      else {
        Arena::ReturnArrayMemory((Arena *)hint._8_8_,__first,(ulong)this->flat_capacity_ << 5);
      }
    }
    this->flat_capacity_ = local_104;
    (this->map_).flat = (KeyValue *)arena;
  }
  return;
}

Assistant:

void ExtensionSet::GrowCapacity(size_t minimum_new_capacity) {
  if (ABSL_PREDICT_FALSE(is_large())) {
    return;  // LargeMap does not have a "reserve" method.
  }
  if (flat_capacity_ >= minimum_new_capacity) {
    return;
  }

  auto new_flat_capacity = flat_capacity_;
  do {
    new_flat_capacity = new_flat_capacity == 0 ? 1 : new_flat_capacity * 4;
  } while (new_flat_capacity < minimum_new_capacity);

  KeyValue* begin = flat_begin();
  KeyValue* end = flat_end();
  AllocatedData new_map;
  Arena* const arena = arena_;
  if (new_flat_capacity > kMaximumFlatCapacity) {
    new_map.large = Arena::Create<LargeMap>(arena);
    LargeMap::iterator hint = new_map.large->begin();
    for (const KeyValue* it = begin; it != end; ++it) {
      hint = new_map.large->insert(hint, {it->first, it->second});
    }
    flat_size_ = static_cast<uint16_t>(-1);
    ABSL_DCHECK(is_large());
  } else {
    new_map.flat = AllocateFlatMap(arena, new_flat_capacity);
    std::copy(begin, end, new_map.flat);
  }

  if (flat_capacity_ > 0) {
    if (arena == nullptr) {
      DeleteFlatMap(begin, flat_capacity_);
    } else {
      arena->ReturnArrayMemory(begin, sizeof(KeyValue) * flat_capacity_);
    }
  }
  flat_capacity_ = new_flat_capacity;
  map_ = new_map;
}